

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void * stb_file_max(char *filename,size_t *length)

{
  FILE *__stream;
  void *__ptr;
  size_t sVar1;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (void *)0x0;
  }
  else {
    sVar1 = *length;
    __ptr = malloc(sVar1 + 1);
    sVar1 = fread(__ptr,1,sVar1,__stream);
    *(undefined1 *)((long)__ptr + sVar1) = 0;
    fclose(__stream);
    *length = sVar1;
  }
  return __ptr;
}

Assistant:

void *  stb_file_max(char *filename, size_t *length)
{
   FILE *f = stb__fopen(filename, "rb");
   char *buffer;
   size_t len, maxlen;
   if (!f) return NULL;
   maxlen = *length;
   buffer = (char *) malloc(maxlen+1);
   len = fread(buffer, 1, maxlen, f);
   buffer[len] = 0;
   fclose(f);
   *length = len;
   return buffer;
}